

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  cmState *this_00;
  cmVariableWatch *this_01;
  cmVariableWatch *vv;
  char *def;
  string *name_local;
  cmMakefile *this_local;
  
  vv = (cmVariableWatch *)cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  if (vv == (cmVariableWatch *)0x0) {
    this_00 = GetState(this);
    vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(this_00,name);
  }
  this_01 = GetVariableWatch(this);
  if ((this_01 != (cmVariableWatch *)0x0) && (vv == (cmVariableWatch *)0x0)) {
    cmVariableWatch::VariableAccessed(this_01,name,2,(char *)0x0,this);
  }
  return vv != (cmVariableWatch *)0x0;
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  const char* def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (cmVariableWatch* vv = this->GetVariableWatch()) {
    if (!def) {
      vv->VariableAccessed(
        name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS, def, this);
    }
  }
#endif
  return def != CM_NULLPTR;
}